

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O2

void __thiscall Diligent::ShaderResourceCacheVk::~ShaderResourceCacheVk(ShaderResourceCacheVk *this)

{
  void *pvVar1;
  DescriptorSet *pDVar2;
  Uint32 t;
  uint Index;
  RefCntAutoPtr<Diligent::IDeviceObject> *this_00;
  ulong uVar3;
  
  pvVar1 = (this->m_pMemory)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    this_00 = (RefCntAutoPtr<Diligent::IDeviceObject> *)
              ((long)pvVar1 + (ulong)this->m_NumSets * 0x30 + 8);
    for (uVar3 = 0; uVar3 < (*(uint *)&this->field_0x1c & 0x7fffffff); uVar3 = uVar3 + 1) {
      RefCntAutoPtr<Diligent::IDeviceObject>::Release(this_00);
      this_00 = this_00 + 4;
    }
    for (Index = 0; Index < this->m_NumSets; Index = Index + 1) {
      pDVar2 = GetDescriptorSet(this,Index);
      DescriptorSetAllocation::~DescriptorSetAllocation(&pDVar2->m_DescriptorSetAllocation);
    }
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&this->m_DbgInitializedResources);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_pMemory);
  return;
}

Assistant:

ShaderResourceCacheVk::~ShaderResourceCacheVk()
{
    if (m_pMemory)
    {
        Resource* pResources = GetFirstResourcePtr();
        for (Uint32 res = 0; res < m_TotalResources; ++res)
            pResources[res].~Resource();
        for (Uint32 t = 0; t < m_NumSets; ++t)
            GetDescriptorSet(t).~DescriptorSet();
    }
}